

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

MTBDD mtbdd_makenode(uint32_t var,MTBDD low,MTBDD high)

{
  long *plVar1;
  FILE *__stream;
  ulong uVar2;
  MTBDD MVar3;
  size_t sVar4;
  ulong mtbdd;
  ulong a;
  ulong mtbdd_00;
  llmsset_t plVar5;
  ulong uVar6;
  ulong low_00;
  ulong b;
  long in_FS_OFFSET;
  int iStack_64;
  ulong uStack_60;
  ulong uStack_58;
  llmsset_t *pplStack_50;
  ulong uStack_48;
  code *pcStack_40;
  int iStack_2c;
  
  if (low == high) {
    return low;
  }
  low_00 = low & 0x7fffffffffffffff;
  uVar6 = low & 0x8000000000000000;
  b = (ulong)var << 0x28 | low_00;
  a = high ^ uVar6;
  pcStack_40 = (code *)0x10dacd;
  uVar2 = llmsset_lookup(nodes,a,b,&iStack_2c);
  if (uVar2 == 0) {
    pcStack_40 = (code *)0x10dadd;
    _mtbdd_makenode_gc(low_00,a);
    pcStack_40 = (code *)0x10daf1;
    mtbdd_00 = a;
    plVar5 = nodes;
    uVar2 = llmsset_lookup(nodes,a,b,&iStack_2c);
    if (uVar2 == 0) {
      pcStack_40 = mtbdd_makemapnode;
      _mtbdd_makenode_exit();
      pplStack_50 = &nodes;
      uStack_60 = a;
      uStack_58 = uVar6;
      uStack_48 = low_00;
      pcStack_40 = (code *)b;
      if ((long)mtbdd_00 < 0) {
        __assert_fail("!MTBDD_HASMARK(low)",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_mtbdd.c"
                      ,0x1f5,"MTBDD mtbdd_makemapnode(uint32_t, MTBDD, MTBDD)");
      }
      uVar2 = (long)plVar5 << 0x28 | mtbdd_00;
      MVar3 = llmsset_lookup(nodes,mtbdd | 0x1000000000000000,uVar2,&iStack_64);
      if (MVar3 == 0) {
        mtbdd_refs_push(mtbdd_00);
        mtbdd_refs_push(mtbdd);
        sylvan_gc_RUN();
        plVar1 = (long *)(*(long *)(in_FS_OFFSET + -0x20) + 0x28);
        *plVar1 = *plVar1 + -0x10;
        MVar3 = llmsset_lookup(nodes,mtbdd | 0x1000000000000000,uVar2,&iStack_64);
        __stream = _stderr;
        if (MVar3 == 0) {
          sVar4 = llmsset_count_marked_RUN(nodes);
          fprintf(__stream,"BDD Unique table full, %zu of %zu buckets filled!\n",sVar4,
                  nodes->table_size);
          exit(1);
        }
      }
      return MVar3;
    }
  }
  return uVar2 | uVar6;
}

Assistant:

MTBDD
_mtbdd_makenode(uint32_t var, MTBDD low, MTBDD high)
{
    // Normalization to keep canonicity
    // low will have no mark

    MTBDD result = low & mtbdd_complement;
    low ^= result;
    high ^= result;

    struct mtbddnode n;
    mtbddnode_makenode(&n, var, low, high);

    int created;
    uint64_t index = llmsset_lookup(nodes, n.a, n.b, &created);
    if (index == 0) {
        _mtbdd_makenode_gc(low, high);
        index = llmsset_lookup(nodes, n.a, n.b, &created);
        if (index == 0) _mtbdd_makenode_exit();
    }

    if (created) sylvan_stats_count(BDD_NODES_CREATED);
    else sylvan_stats_count(BDD_NODES_REUSED);

    result |= index;
    return result;
}